

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

int parse_source_token(Context *ctx,SourceArgInfo *info)

{
  uint32 uVar1;
  uint uVar2;
  SourceMod SVar3;
  int iVar4;
  RegisterType RVar5;
  uint *puVar6;
  MOJOSHADER_swizzle *pMVar7;
  bool bVar8;
  VariableList *pVVar9;
  RegisterList *pRVar10;
  uint uVar11;
  uchar *puVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  RegisterList *pRVar19;
  
  uVar1 = ctx->tokencount;
  if (uVar1 == 0) {
    failf(ctx,"%s","Out of tokens in source parameter");
    return 0;
  }
  puVar6 = ctx->tokens;
  uVar2 = *puVar6;
  info->token = puVar6;
  info->regnum = uVar2 & 0x7ff;
  info->relative = uVar2 >> 0xd & 1;
  info->src_mod = uVar2 >> 0x18 & (SRCMOD_TOTAL|SRCMOD_NEGATE);
  uVar16 = uVar2 >> 0x1c & 7;
  uVar17 = uVar2 >> 8 & 0x18;
  info->regtype = uVar16 + uVar17;
  uVar16 = (uVar16 + uVar17) - 0xb;
  if (uVar16 < 3) {
    uVar16 = uVar16 * 0x800;
    info->regtype = REG_TYPE_CONST;
    info->regnum = (uVar2 & 0x7ff) + uVar16 + 0x800;
  }
  pRVar10 = (RegisterList *)(ulong)uVar16;
  uVar16 = uVar2 >> 0x10 & 0xff;
  if ((info->regtype == REG_TYPE_INPUT) && (uVar17 = ctx->swizzles_count, uVar17 != 0)) {
    uVar18 = info->regnum | 0x10000;
    pRVar19 = (ctx->attributes).next;
    do {
      if (pRVar19 == (RegisterList *)0x0) {
        pRVar10 = (RegisterList *)0x0;
        break;
      }
      uVar11 = pRVar19->regtype << 0x10 | pRVar19->regnum;
      if (uVar18 == uVar11) {
        bVar8 = false;
        pRVar10 = pRVar19;
      }
      else if (uVar18 < uVar11) {
        pRVar10 = (RegisterList *)0x0;
        bVar8 = false;
      }
      else {
        pRVar19 = pRVar19->next;
        bVar8 = true;
      }
    } while (bVar8);
    if (pRVar10 != (RegisterList *)0x0) {
      pMVar7 = ctx->swizzles;
      lVar15 = 0;
      puVar12 = pMVar7->swizzles + (uVar2 >> 0x12 & 3);
      do {
        bVar8 = true;
        if ((*(MOJOSHADER_usage *)(pMVar7->swizzles + lVar15 + -8) == pRVar10->usage) &&
           (*(uint *)(pMVar7->swizzles + lVar15 + -4) == pRVar10->index)) {
          puVar12 = (uchar *)(ulong)((uint)pMVar7->swizzles[lVar15 + (ulong)(uVar2 >> 0x16 & 3)] <<
                                     6 | (uint)pMVar7->swizzles[lVar15 + (ulong)(uVar2 >> 0x14 & 3)]
                                         << 4 |
                                    (uint)(pMVar7->swizzles + (uVar2 >> 0x12 & 3))[lVar15] << 2 |
                                    (uint)pMVar7->swizzles[lVar15 + (ulong)(uVar2 >> 0x10 & 3)]);
          bVar8 = false;
        }
        if (!bVar8) {
          uVar16 = (uint)puVar12;
          break;
        }
        lVar15 = lVar15 + 0xc;
      } while ((ulong)(uVar17 + (uVar17 == 0)) * 0xc != lVar15);
    }
  }
  info->swizzle = uVar16;
  info->swizzle_x = uVar16 & 3;
  info->swizzle_y = uVar16 >> 2 & 3;
  info->swizzle_z = uVar16 >> 4 & 3;
  info->swizzle_w = uVar16 >> 6 & 3;
  ctx->tokens = puVar6 + 1;
  ctx->tokencount = uVar1 - 1;
  ctx->current_position = ctx->current_position + 4;
  if ((uVar2 & 0xc000) != 0) {
    failf(ctx,"%s","Reserved bits #1 in source token must be zero");
  }
  if (-1 < (int)uVar2) {
    failf(ctx,"%s","Reserved bit #2 in source token must be one");
  }
  if ((info->relative != 0) && (ctx->tokencount == 0)) {
    failf(ctx,"%s","Out of tokens in relative source parameter");
    info->relative = 0;
  }
  if (info->relative == 0) {
    iVar14 = 1;
  }
  else {
    if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->major_ver < 3)) {
      failf(ctx,"%s","Relative addressing in pixel shader version < 3.0");
    }
    if (ctx->major_ver < 2) {
      info->relative_regtype = REG_TYPE_ADDRESS;
      info->relative_regnum = 0;
      iVar14 = 1;
      uVar17 = 0;
    }
    else {
      uVar2 = *ctx->tokens;
      ctx->tokens = ctx->tokens + 1;
      ctx->tokencount = ctx->tokencount - 1;
      ctx->current_position = ctx->current_position + 4;
      info->relative_regnum = uVar2 & 0x7ff;
      info->relative_regtype =
           uVar2 >> 8 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT) | uVar2 >> 0x1c & REG_TYPE_CONSTINT
      ;
      if (-1 < (int)uVar2) {
        failf(ctx,"%s","bit #31 in relative address must be set");
      }
      if ((uVar2 & 0xf00e000) != 0) {
        failf(ctx,"%s","relative address reserved bit must be zero");
      }
      if ((info->relative_regtype != REG_TYPE_ADDRESS) && (info->relative_regtype != REG_TYPE_LOOP))
      {
        failf(ctx,"%s","invalid register for relative address");
      }
      if (info->relative_regnum != 0) {
        failf(ctx,"%s","invalid register for relative address");
      }
      uVar17 = uVar2 >> 0x10 & 3;
      uVar16 = uVar2 >> 0x12 & 3;
      if (((uVar17 != uVar16) || (uVar18 = uVar2 >> 0x14 & 3, uVar16 != uVar18)) ||
         (uVar18 != (uVar2 >> 0x16 & 3))) {
        failf(ctx,"%s","relative address needs replicate swizzle");
      }
      iVar14 = 2;
    }
    info->relative_component = uVar17;
    if (info->regtype == REG_TYPE_CONST) {
      if (ctx->ignores_ctab == 0) {
        if ((ctx->ctab).have_ctab == 0) {
          pcVar13 = "relative addressing unsupported without a CTAB";
        }
        else {
          determine_constants_arrays(ctx);
          pVVar9 = ctx->variables;
          if (pVVar9 != (VariableList *)0x0) {
            do {
              if ((pVVar9->index <= info->regnum) && (info->regnum < pVVar9->index + pVVar9->count))
              {
                pVVar9->used = 1;
                info->relative_array = pVVar9;
                RVar5 = info->relative_regtype;
                iVar4 = info->relative_regnum;
                if (0 < iVar4 && RVar5 == REG_TYPE_COLOROUT) {
                  ctx->have_multi_color_outputs = 1;
                }
                reglist_insert(ctx,&ctx->used_registers,RVar5,iVar4);
                goto LAB_0011d3a5;
              }
              pVVar9 = pVVar9->next;
            } while (pVVar9 != (VariableList *)0x0);
          }
          pcVar13 = "relative addressing of indeterminate array";
        }
        goto LAB_0011d39b;
      }
    }
    else if (info->regtype == REG_TYPE_INPUT) {
      if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) || (ctx->major_ver < 3)) {
        failf(ctx,"%s","relative addressing of input registers not supported in this shader model");
      }
      ctx->have_relative_input_registers = 1;
    }
    else {
      pcVar13 = "relative addressing of invalid register";
LAB_0011d39b:
      failf(ctx,"%s",pcVar13);
    }
  }
LAB_0011d3a5:
  SVar3 = info->src_mod;
  if (SVar3 < SRCMOD_TOTAL) {
    if ((0x7fcU >> (SVar3 & 0x1f) & 1) == 0) {
      if ((((0x1803U >> (SVar3 & 0x1f) & 1) != 0) || (ctx->major_ver < 2)) ||
         (info->regtype == REG_TYPE_MAX)) goto LAB_0011d3e9;
      pcVar13 = "NOT only allowed on predicate register.";
    }
    else {
      if (ctx->major_ver < 2) goto LAB_0011d3e9;
      pcVar13 = "illegal source mod for this Shader Model.";
    }
  }
  else {
    pcVar13 = "Unknown source modifier";
  }
  failf(ctx,"%s",pcVar13);
LAB_0011d3e9:
  if (ctx->isfail == 0) {
    iVar4 = info->regnum;
    RVar5 = info->regtype;
    if (0 < iVar4 && RVar5 == REG_TYPE_COLOROUT) {
      ctx->have_multi_color_outputs = 1;
    }
    pRVar10 = reglist_insert(ctx,&ctx->used_registers,RVar5,iVar4);
    if ((pRVar10 != (RegisterList *)0x0 && info->regtype == REG_TYPE_TEMP) &&
       (pRVar10->written == 0)) {
      failf(ctx,"Temp register r%d used uninitialized",(ulong)(uint)info->regnum);
    }
  }
  return iVar14;
}

Assistant:

static int parse_source_token(Context *ctx, SourceArgInfo *info)
{
    int retval = 1;

    if (ctx->tokencount == 0)
    {
        fail(ctx, "Out of tokens in source parameter");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 14) & 0x3); // bits 14 through 15
    const int reserved2 = (int) ((token >> 31) & 0x1); // bit 31

    info->token = ctx->tokens;
    info->regnum = (int) (token & 0x7ff);  // bits 0 through 10
    info->relative = (int) ((token >> 13) & 0x1); // bit 13
    const int swizzle = (int) ((token >> 16) & 0xFF); // bits 16 through 23
    info->src_mod = (SourceMod) ((token >> 24) & 0xF); // bits 24 through 27
    info->regtype = (RegisterType) (((token >> 28) & 0x7) | ((token >> 8) & 0x18));  // bits 28-30, 11-12

    // all the REG_TYPE_CONSTx types are the same register type, it's just
    //  split up so its regnum can be > 2047 in the bytecode. Clean it up.
    if (info->regtype == REG_TYPE_CONST2)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 2048;
    } // else if
    else if (info->regtype == REG_TYPE_CONST3)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 4096;
    } // else if
    else if (info->regtype == REG_TYPE_CONST4)
    {
        info->regtype = REG_TYPE_CONST;
        info->regnum += 6144;
    } // else if

    info->swizzle = adjust_swizzle(ctx, info->regtype, info->regnum, swizzle);
    info->swizzle_x = ((info->swizzle >> 0) & 0x3);
    info->swizzle_y = ((info->swizzle >> 2) & 0x3);
    info->swizzle_z = ((info->swizzle >> 4) & 0x3);
    info->swizzle_w = ((info->swizzle >> 6) & 0x3);

    // swallow token for now, for multiple calls in a row.
    adjust_token_position(ctx, 1);

    if (reserved1 != 0x0)
        fail(ctx, "Reserved bits #1 in source token must be zero");

    if (reserved2 != 0x1)
        fail(ctx, "Reserved bit #2 in source token must be one");

    if ((info->relative) && (ctx->tokencount == 0))
    {
        fail(ctx, "Out of tokens in relative source parameter");
        info->relative = 0;  // don't try to process it.
    } // if

    if (info->relative)
    {
        if ( (shader_is_pixel(ctx)) && (!shader_version_atleast(ctx, 3, 0)) )
            fail(ctx, "Relative addressing in pixel shader version < 3.0");

        // Shader Model 1 doesn't have an extra token to specify the
        //  relative register: it's always a0.x.
        if (!shader_version_atleast(ctx, 2, 0))
        {
            info->relative_regnum = 0;
            info->relative_regtype = REG_TYPE_ADDRESS;
            info->relative_component = 0;
        } // if

        else  // Shader Model 2 and later...
        {
            const uint32 reltoken = SWAP32(*(ctx->tokens));
            // swallow token for now, for multiple calls in a row.
            adjust_token_position(ctx, 1);

            const int relswiz = (int) ((reltoken >> 16) & 0xFF);
            info->relative_regnum = (int) (reltoken & 0x7ff);
            info->relative_regtype = (RegisterType)
                                        (((reltoken >> 28) & 0x7) |
                                        ((reltoken >> 8) & 0x18));

            if (((reltoken >> 31) & 0x1) == 0)
                fail(ctx, "bit #31 in relative address must be set");

            if ((reltoken & 0xF00E000) != 0)  // usused bits.
                fail(ctx, "relative address reserved bit must be zero");

            switch (info->relative_regtype)
            {
                case REG_TYPE_LOOP:
                case REG_TYPE_ADDRESS:
                    break;
                default:
                    fail(ctx, "invalid register for relative address");
                    break;
            } // switch

            if (info->relative_regnum != 0)  // true for now.
                fail(ctx, "invalid register for relative address");

            if (!replicate_swizzle(relswiz))
                fail(ctx, "relative address needs replicate swizzle");

            info->relative_component = (relswiz & 0x3);

            retval++;
        } // else

        if (info->regtype == REG_TYPE_INPUT)
        {
            if ( (shader_is_pixel(ctx)) || (!shader_version_atleast(ctx, 3, 0)) )
                fail(ctx, "relative addressing of input registers not supported in this shader model");
            ctx->have_relative_input_registers = 1;
        } // if
        else if (info->regtype == REG_TYPE_CONST)
        {
            // figure out what array we're in...
            if (!ctx->ignores_ctab)
            {
                if (!ctx->ctab.have_ctab)  // hard to do efficiently without!
                    fail(ctx, "relative addressing unsupported without a CTAB");
                else
                {
                    determine_constants_arrays(ctx);

                    VariableList *var;
                    const int reltarget = info->regnum;
                    for (var = ctx->variables; var != NULL; var = var->next)
                    {
                        const int lo = var->index;
                        if ( (reltarget >= lo) && (reltarget < (lo + var->count)) )
                            break;  // match!
                    } // for

                    if (var == NULL)
                        fail(ctx, "relative addressing of indeterminate array");
                    else
                    {
                        var->used = 1;
                        info->relative_array = var;
                        set_used_register(ctx, info->relative_regtype, info->relative_regnum, 0);
                    } // else
                } // else
            } // if
        } // else if
        else
        {
            fail(ctx, "relative addressing of invalid register");
        } // else
    } // if

    switch (info->src_mod)
    {
        case SRCMOD_NONE:
        case SRCMOD_ABSNEGATE:
        case SRCMOD_ABS:
        case SRCMOD_NEGATE:
            break; // okay in any shader model.

        // apparently these are only legal in Shader Model 1.x ...
        case SRCMOD_BIASNEGATE:
        case SRCMOD_BIAS:
        case SRCMOD_SIGNNEGATE:
        case SRCMOD_SIGN:
        case SRCMOD_COMPLEMENT:
        case SRCMOD_X2NEGATE:
        case SRCMOD_X2:
        case SRCMOD_DZ:
        case SRCMOD_DW:
            if (shader_version_atleast(ctx, 2, 0))
                fail(ctx, "illegal source mod for this Shader Model.");
            break;

        case SRCMOD_NOT:  // !!! FIXME: I _think_ this is right...
            if (shader_version_atleast(ctx, 2, 0))
            {
                if (info->regtype != REG_TYPE_PREDICATE)
                    fail(ctx, "NOT only allowed on predicate register.");
            } // if
            break;

        default:
            fail(ctx, "Unknown source modifier");
    } // switch

    // !!! FIXME: docs say this for sm3 ... check these!
    //  "The negate modifier cannot be used on second source register of these
    //   instructions: m3x2 - ps, m3x3 - ps, m3x4 - ps, m4x3 - ps, and
    //   m4x4 - ps."
    //  "If any version 3 shader reads from one or more constant float
    //   registers (c#), one of the following must be true.
    //    All of the constant floating-point registers must use the abs modifier.
    //    None of the constant floating-point registers can use the abs modifier.

    if (!isfail(ctx))
    {
        RegisterList *reg;
        reg = set_used_register(ctx, info->regtype, info->regnum, 0);
        // !!! FIXME: this test passes if you write to the register
        // !!! FIXME:  in this same instruction, because we parse the
        // !!! FIXME:  destination token first.
        // !!! FIXME: Microsoft's shader validation explicitly checks temp
        // !!! FIXME:  registers for this...do they check other writable ones?
        if ((info->regtype == REG_TYPE_TEMP) && (reg) && (!reg->written))
            failf(ctx, "Temp register r%d used uninitialized", info->regnum);
    } // if

    return retval;
}